

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkPartStitchChoices(Abc_Ntk_t *pNtk,Vec_Ptr_t *vParts)

{
  Nm_Man_t *pNVar1;
  long *plVar2;
  uint uVar3;
  int iVar4;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  char *pcVar7;
  Vec_Ptr_t *pVVar8;
  long lVar9;
  Hop_Man_t *pMan;
  Abc_Ntk_t *pAVar10;
  long lVar11;
  char *__format;
  long lVar12;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                  ,0x3f2,"Abc_Ntk_t *Abc_NtkPartStitchChoices(Abc_Ntk_t *, Vec_Ptr_t *)");
  }
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
  if (0 < vParts->nSize) {
    lVar11 = 0;
    do {
      pAVar10 = (Abc_Ntk_t *)vParts->pArray[lVar11];
      if (pAVar10->ntkType != ABC_NTK_STRASH) {
        __assert_fail("Abc_NtkIsStrash(pNtkTemp)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                      ,0x3f8,"Abc_Ntk_t *Abc_NtkPartStitchChoices(Abc_Ntk_t *, Vec_Ptr_t *)");
      }
      Abc_NtkCleanCopy(pAVar10);
      pAVar5 = Abc_AigConst1(pNtk_00);
      pAVar6 = Abc_AigConst1(pAVar10);
      (pAVar6->field_6).pCopy = pAVar5;
      pVVar8 = pAVar10->vCis;
      if (0 < pVVar8->nSize) {
        lVar12 = 0;
        do {
          pAVar5 = (Abc_Obj_t *)pVVar8->pArray[lVar12];
          pNVar1 = pNtk_00->pManName;
          pcVar7 = Abc_ObjName(pAVar5);
          uVar3 = Nm_ManFindIdByNameTwoTypes(pNVar1,pcVar7,2,5);
          if (uVar3 == 0xffffffff) {
            pcVar7 = Abc_ObjName(pAVar5);
            __format = "Cannot find CI node %s in the original network.\n";
            goto LAB_002ea631;
          }
          if (((int)uVar3 < 0) || (pNtk_00->vObjs->nSize <= (int)uVar3)) goto LAB_002ea650;
          pAVar5->field_6 =
               *(anon_union_8_4_617c9805_for_Abc_Obj_t__17 *)(pNtk_00->vObjs->pArray + uVar3);
          lVar12 = lVar12 + 1;
          pVVar8 = pAVar10->vCis;
        } while (lVar12 < pVVar8->nSize);
      }
      pVVar8 = Abc_AigDfs(pAVar10,1,0);
      if (0 < pVVar8->nSize) {
        lVar12 = 0;
        do {
          plVar2 = (long *)pVVar8->pArray[lVar12];
          lVar9 = *(long *)(*(long *)(*plVar2 + 0x20) + 8);
          pAVar5 = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,
                              (Abc_Obj_t *)
                              ((ulong)(*(uint *)((long)plVar2 + 0x14) >> 10 & 1) ^
                              *(ulong *)(*(long *)(lVar9 + (long)*(int *)plVar2[4] * 8) + 0x40)),
                              (Abc_Obj_t *)
                              ((ulong)(*(uint *)((long)plVar2 + 0x14) >> 0xb & 1) ^
                              *(ulong *)(*(long *)(lVar9 + (long)((int *)plVar2[4])[1] * 8) + 0x40))
                             );
          plVar2[8] = (long)pAVar5;
          if (((ulong)pAVar5 & 1) != 0) {
            __assert_fail("!Abc_ObjIsComplement(pObj->pCopy)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                          ,0x40d,"Abc_Ntk_t *Abc_NtkPartStitchChoices(Abc_Ntk_t *, Vec_Ptr_t *)");
          }
          if (((ulong)plVar2 & 1) != 0) {
            pcVar7 = "!Abc_ObjIsComplement(pNode)";
LAB_002ea69e:
            __assert_fail(pcVar7,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                          ,400,"int Abc_AigNodeIsChoice(Abc_Obj_t *)");
          }
          if (*(int *)*plVar2 != 3) {
            pcVar7 = "Abc_NtkIsStrash(pNode->pNtk)";
            goto LAB_002ea69e;
          }
          if ((plVar2[7] != 0) && (0 < *(int *)((long)plVar2 + 0x2c))) {
            for (lVar9 = plVar2[7]; lVar9 != 0; lVar9 = *(long *)(lVar9 + 0x38)) {
              *(long *)(*(long *)(lVar9 + 0x40) + 0x40) = plVar2[8];
            }
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < pVVar8->nSize);
      }
      if (pVVar8->pArray != (void **)0x0) {
        free(pVVar8->pArray);
        pVVar8->pArray = (void **)0x0;
      }
      if (pVVar8 != (Vec_Ptr_t *)0x0) {
        free(pVVar8);
      }
      pVVar8 = pAVar10->vCos;
      if (0 < pVVar8->nSize) {
        lVar12 = 0;
        do {
          pAVar5 = (Abc_Obj_t *)pVVar8->pArray[lVar12];
          pNVar1 = pNtk_00->pManName;
          pcVar7 = Abc_ObjName(pAVar5);
          uVar3 = Nm_ManFindIdByNameTwoTypes(pNVar1,pcVar7,3,4);
          if (uVar3 == 0xffffffff) {
            pcVar7 = Abc_ObjName(pAVar5);
            __format = "Cannot find CO node %s in the original network.\n";
LAB_002ea631:
            printf(__format,pcVar7);
            return (Abc_Ntk_t *)0x0;
          }
          if (((int)uVar3 < 0) || (pNtk_00->vObjs->nSize <= (int)uVar3)) {
LAB_002ea650:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pAVar6 = (Abc_Obj_t *)pNtk_00->vObjs->pArray[uVar3];
          (pAVar5->field_6).pCopy = pAVar6;
          Abc_ObjAddFanin(pAVar6,(Abc_Obj_t *)
                                 ((ulong)(*(uint *)&pAVar5->field_0x14 >> 10 & 1) ^
                                 *(ulong *)((long)pAVar5->pNtk->vObjs->pArray
                                                  [*(pAVar5->vFanins).pArray] + 0x40)));
          lVar12 = lVar12 + 1;
          pVVar8 = pAVar10->vCos;
        } while (lVar12 < pVVar8->nSize);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < vParts->nSize);
  }
  pVVar8 = pNtk->vCos;
  if (0 < pVVar8->nSize) {
    lVar11 = 0;
    do {
      plVar2 = (long *)pVVar8->pArray[lVar11];
      if ((((Abc_Obj_t *)plVar2[8])->vFanins).nSize == 0) {
        Abc_ObjAddFanin((Abc_Obj_t *)plVar2[8],
                        (Abc_Obj_t *)
                        ((ulong)(*(uint *)((long)plVar2 + 0x14) >> 10 & 1) ^
                        *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                            (long)*(int *)plVar2[4] * 8) + 0x40)));
      }
      lVar11 = lVar11 + 1;
      pVVar8 = pNtk->vCos;
    } while (lVar11 < pVVar8->nSize);
  }
  pMan = Abc_NtkPartStartHop(pNtk_00);
  pAVar10 = Abc_NtkHopRemoveLoops(pNtk_00,pMan);
  Abc_NtkDelete(pNtk_00);
  iVar4 = Abc_NtkCheck(pAVar10);
  if (iVar4 == 0) {
    puts("Abc_NtkPartStitchChoices: The network check has failed.");
    Abc_NtkDelete(pAVar10);
    pAVar10 = (Abc_Ntk_t *)0x0;
  }
  return pAVar10;
}

Assistant:

Abc_Ntk_t * Abc_NtkPartStitchChoices( Abc_Ntk_t * pNtk, Vec_Ptr_t * vParts )
{
    extern Abc_Ntk_t * Abc_NtkHopRemoveLoops( Abc_Ntk_t * pNtk, Hop_Man_t * pMan );
    Hop_Man_t * pMan;
    Vec_Ptr_t * vNodes;
    Abc_Ntk_t * pNtkNew, * pNtkTemp;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, iNodeId;

    // start a new network similar to the original one
    assert( Abc_NtkIsStrash(pNtk) );
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );

    // annotate parts to point to the new network
    Vec_PtrForEachEntry( Abc_Ntk_t *, vParts, pNtkTemp, i )
    {
        assert( Abc_NtkIsStrash(pNtkTemp) );
        Abc_NtkCleanCopy( pNtkTemp );

        // map the CI nodes
        Abc_AigConst1(pNtkTemp)->pCopy = Abc_AigConst1(pNtkNew);
        Abc_NtkForEachCi( pNtkTemp, pObj, k )
        {
            iNodeId = Nm_ManFindIdByNameTwoTypes( pNtkNew->pManName, Abc_ObjName(pObj), ABC_OBJ_PI, ABC_OBJ_BO );
            if ( iNodeId == -1 )
            {
                printf( "Cannot find CI node %s in the original network.\n", Abc_ObjName(pObj) );
                return NULL;
            }
            pObj->pCopy = Abc_NtkObj( pNtkNew, iNodeId );
        }

        // add the internal nodes while saving representatives
        vNodes = Abc_AigDfs( pNtkTemp, 1, 0 );
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, k )
        {
            pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
            assert( !Abc_ObjIsComplement(pObj->pCopy) );
            if ( Abc_AigNodeIsChoice(pObj) )
                for ( pFanin = (Abc_Obj_t *)pObj->pData; pFanin; pFanin = (Abc_Obj_t *)pFanin->pData )
                    pFanin->pCopy->pCopy = pObj->pCopy;
        }
        Vec_PtrFree( vNodes );

        // map the CO nodes
        Abc_NtkForEachCo( pNtkTemp, pObj, k )
        {
            iNodeId = Nm_ManFindIdByNameTwoTypes( pNtkNew->pManName, Abc_ObjName(pObj), ABC_OBJ_PO, ABC_OBJ_BI );
            if ( iNodeId == -1 )
            {
                printf( "Cannot find CO node %s in the original network.\n", Abc_ObjName(pObj) );
                return NULL;
            }
            pObj->pCopy = Abc_NtkObj( pNtkNew, iNodeId );
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjChild0Copy(pObj) );
        }
    }

    // connect the remaining POs
/*
    Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pCopy = Abc_NtkCi( pNtkNew, i );
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->pCopy = Abc_NtkCo( pNtkNew, i );
*/
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        if ( Abc_ObjFaninNum(pObj->pCopy) == 0 )
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjChild0Copy(pObj) );
    }

    // transform into the HOP manager
    pMan = Abc_NtkPartStartHop( pNtkNew );
    pNtkNew = Abc_NtkHopRemoveLoops( pNtkTemp = pNtkNew, pMan );
    Abc_NtkDelete( pNtkTemp );

    // check correctness of the new network
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkPartStitchChoices: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}